

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ust.hpp
# Opt level: O1

StackTrace * ust::generate(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  ulong uVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  key_type *pkVar5;
  pointer pSVar6;
  char cVar7;
  int iVar8;
  istream *piVar9;
  int *piVar10;
  iterator iVar11;
  mapped_type *pmVar12;
  char *pcVar13;
  size_t sVar14;
  iterator iVar15;
  list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *plVar16;
  _Node *p_Var17;
  ostream *poVar18;
  mapped_type *pmVar19;
  _Rb_tree_node_base *p_Var20;
  long lVar21;
  undefined8 uVar22;
  char *cmd;
  void *pvVar23;
  ulong uVar24;
  key_type *pkVar25;
  string *this;
  pointer pSVar26;
  _Rb_tree_node_base *p_Var27;
  StackTrace *in_RDI;
  bool bVar28;
  string path;
  string device;
  string inode;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  elems;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  fileData;
  vector<ust::StackTraceEntry,_std::allocator<ust::StackTraceEntry>_> stackTrace;
  string line;
  string procMapFileName;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  fileAddresses;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  addressMaps;
  void *stack [64];
  ifstream infile;
  regex addrToLineRegex;
  undefined1 local_1728 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1708;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_16f8;
  string local_16e8;
  undefined1 local_16c8 [32];
  ulong local_16a8;
  void *local_16a0;
  char *local_1698;
  ulong local_1690;
  undefined1 local_1688 [32];
  _Base_ptr local_1668;
  size_t local_1660;
  vector<ust::StackTraceEntry,_std::allocator<ust::StackTraceEntry>_> local_1658;
  StackTrace *local_1638;
  undefined1 *local_1630;
  undefined8 local_1628;
  undefined1 local_1620;
  undefined7 uStack_161f;
  long *local_1610 [2];
  long local_1600 [2];
  undefined1 local_15f0 [120];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1578 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  local_1478;
  string local_1448 [16];
  long local_1240 [65];
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_1038 [3];
  ios_base local_fc8 [8];
  ios_base local_fc0 [3984];
  
  local_1638 = in_RDI;
  iVar8 = pthread_mutex_lock((pthread_mutex_t *)&generate::mtx);
  if (iVar8 == 0) {
    local_1658.super__Vector_base<ust::StackTraceEntry,_std::allocator<ust::StackTraceEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1658.super__Vector_base<ust::StackTraceEntry,_std::allocator<ust::StackTraceEntry>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1658.super__Vector_base<ust::StackTraceEntry,_std::allocator<ust::StackTraceEntry>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1478._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1478._M_impl.super__Rb_tree_header._M_header;
    local_1478._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1478._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1478._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1630 = &local_1620;
    local_1628 = 0;
    local_1620 = 0;
    local_1610[0] = local_1600;
    local_1478._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1478._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1610,"/proc/self/maps","");
    std::ifstream::ifstream(local_1240,(char *)local_1610[0],_S_in);
    do {
      cVar7 = std::ios::widen((char)*(undefined8 *)(local_1240[0] + -0x18) +
                              (char)(istream *)local_1240);
      piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_1240,(string *)&local_1630,cVar7);
      if (((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) != 0) break;
      std::__cxx11::istringstream::istringstream
                ((istringstream *)local_1038,(string *)&local_1630,_S_in);
      local_1448[0]._M_string_length = 0;
      local_1448[0].field_2._M_local_buf[0] = '\0';
      local_15f0._8_8_ = (pointer)0x0;
      local_15f0._16_8_ = local_15f0._16_8_ & 0xffffffffffffff00;
      local_1688._0_8_ = local_1688 + 0x10;
      local_1688._8_8_ = 0;
      local_1688._16_8_ = local_1688._16_8_ & 0xffffffffffffff00;
      local_1708._M_allocated_capacity = (size_type)&local_16f8;
      local_1708._8_8_ = (undefined1 *)0x0;
      local_16f8._M_local_buf[0] = '\0';
      local_16e8._M_dataplus._M_p = (pointer)&local_16e8.field_2;
      local_16e8._M_string_length = 0;
      local_16e8.field_2._M_allocated_capacity =
           local_16e8.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_1728._0_8_ = local_1728 + 0x10;
      local_1728._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_1728._16_8_ = local_1728._16_8_ & 0xffffffffffffff00;
      local_15f0._0_8_ = local_15f0 + 0x10;
      local_1448[0]._M_dataplus._M_p = (pointer)&local_1448[0].field_2;
      piVar9 = std::operator>>((istream *)local_1038,(string *)local_1448);
      piVar9 = std::operator>>(piVar9,(string *)local_15f0);
      piVar9 = std::operator>>(piVar9,(string *)local_1688);
      piVar9 = std::operator>>(piVar9,(string *)local_1708._M_local_buf);
      piVar9 = std::operator>>(piVar9,(string *)&local_16e8);
      piVar9 = std::operator>>(piVar9,(string *)local_1728);
      local_16a8 = CONCAT44(local_16a8._4_4_,
                            *(uint *)(piVar9 + *(long *)(*(long *)piVar9 + -0x18) + 0x20));
      if ((*(uint *)(piVar9 + *(long *)(*(long *)piVar9 + -0x18) + 0x20) & 5) == 0) {
        local_16c8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_16c8._8_8_ = (pointer)0x0;
        local_16c8._16_8_ = (pointer)0x0;
        split<std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  (local_1448,'-',
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_16c8);
        pcVar13 = *(char **)local_16c8._0_8_;
        piVar10 = __errno_location();
        iVar8 = *piVar10;
        *piVar10 = 0;
        local_16a0 = (void *)strtoull(pcVar13,&local_1698,0x10);
        if (local_1698 == pcVar13) {
          std::__throw_invalid_argument("stoull");
LAB_001a3543:
          std::__throw_invalid_argument("stoull");
LAB_001a354f:
          std::__throw_out_of_range("stoull");
        }
        else {
          if (*piVar10 != 0) {
            if (*piVar10 != 0x22) goto LAB_001a25e2;
            goto LAB_001a354f;
          }
          *piVar10 = iVar8;
LAB_001a25e2:
          Catch::clara::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_16c8);
          local_16c8._0_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_16c8._8_8_ = (pointer)0x0;
          local_16c8._16_8_ = (pointer)0x0;
          split<std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    (local_1448,'-',
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_16c8);
          pcVar13 = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_16c8._0_8_ + 0x20))->_M_dataplus)._M_p;
          iVar8 = *piVar10;
          *piVar10 = 0;
          local_1690 = strtoull(pcVar13,&local_1698,0x10);
          if (local_1698 == pcVar13) goto LAB_001a3543;
          if (*piVar10 == 0) {
            *piVar10 = iVar8;
LAB_001a266a:
            Catch::clara::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_16c8);
            iVar11 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                     ::find(&local_1478,(key_type *)local_1728);
            if ((_Rb_tree_header *)iVar11._M_node == &local_1478._M_impl.super__Rb_tree_header) {
              pmVar12 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                                      *)&local_1478,(key_type *)local_1728);
              pmVar12->first = (unsigned_long)local_16a0;
              uVar24 = local_1690;
            }
            else {
              pmVar12 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                                      *)&local_1478,(key_type *)local_1728);
              pvVar23 = (void *)pmVar12->first;
              pmVar12 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                                      *)&local_1478,(key_type *)local_1728);
              if (local_16a0 < pvVar23) {
                pvVar23 = local_16a0;
              }
              pmVar12->first = (unsigned_long)pvVar23;
              pmVar12 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                                      *)&local_1478,(key_type *)local_1728);
              uVar2 = pmVar12->second;
              pmVar12 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                                      *)&local_1478,(key_type *)local_1728);
              uVar24 = local_1690;
              if (local_1690 < uVar2) {
                uVar24 = uVar2;
              }
            }
            pmVar12->second = uVar24;
            goto LAB_001a2731;
          }
          if (*piVar10 != 0x22) goto LAB_001a266a;
        }
        std::__throw_out_of_range("stoull");
        goto LAB_001a3567;
      }
LAB_001a2731:
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1728._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1728 + 0x10))
      {
        operator_delete((void *)local_1728._0_8_,local_1728._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_16e8._M_dataplus._M_p != &local_16e8.field_2) {
        operator_delete(local_16e8._M_dataplus._M_p,local_16e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1708._M_allocated_capacity != &local_16f8) {
        operator_delete((void *)local_1708._M_allocated_capacity,
                        CONCAT71(local_16f8._M_allocated_capacity._1_7_,local_16f8._M_local_buf[0])
                        + 1);
      }
      if ((undefined1 *)local_1688._0_8_ != local_1688 + 0x10) {
        operator_delete((void *)local_1688._0_8_,local_1688._16_8_ + 1);
      }
      if ((undefined1 *)local_15f0._0_8_ != local_15f0 + 0x10) {
        operator_delete((void *)local_15f0._0_8_,
                        (ulong)((long)(_Rb_tree_color *)local_15f0._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1448[0]._M_dataplus._M_p != &local_1448[0].field_2) {
        operator_delete(local_1448[0]._M_dataplus._M_p,
                        CONCAT71(local_1448[0].field_2._M_allocated_capacity._1_7_,
                                 local_1448[0].field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)local_1038);
      std::ios_base::~ios_base(local_fc0);
    } while ((local_16a8 & 5) == 0);
    iVar8 = backtrace(local_1448,0x40);
    memmove(local_1448,&local_1448[0]._M_string_length,(long)iVar8 * 8 - 8);
    local_16a0 = (void *)backtrace_symbols(local_1448,iVar8 - 1U);
    if (local_16a0 != (void *)0x0) {
      if (1 < iVar8) {
        local_1690 = (ulong)(iVar8 - 1U);
        uVar24 = 0;
        do {
          local_1688._0_8_ = local_1688 + 0x10;
          local_1688._8_8_ = 0;
          local_1688._16_8_ = local_1688._16_8_ & 0xffffffffffffff00;
          local_1708._M_allocated_capacity = (size_type)&local_16f8;
          local_1708._8_8_ = (undefined1 *)0x0;
          local_16f8._M_local_buf[0] = '\0';
          local_16e8._M_dataplus._M_p = (pointer)&local_16e8.field_2;
          local_16e8._M_string_length = 0;
          local_16e8.field_2._M_allocated_capacity =
               local_16e8.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_16a8 = uVar24;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_1728,*(char **)((long)local_16a0 + uVar24 * 8),
                     (allocator<char> *)local_1038);
          std::__cxx11::string::find((char *)local_1728,0x1a8bdc,0);
          std::__cxx11::string::find((char *)local_1728,0x1a7702,0);
          std::__cxx11::string::substr((ulong)local_1038,(ulong)local_1728);
          std::__cxx11::string::operator=((string *)local_1708._M_local_buf,(string *)local_1038);
          if ((_AutomatonPtr *)local_1038[0]._0_8_ != &local_1038[0]._M_automaton) {
            operator_delete((void *)local_1038[0]._0_8_,
                            (ulong)((long)&((local_1038[0]._M_automaton.
                                             super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr)->super__NFA_base)._M_paren_stack.
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data._M_start + 1));
          }
          pcVar13 = realpath((char *)local_1708._M_allocated_capacity,(char *)local_1038);
          if (pcVar13 != (char *)0x0) {
            local_15f0._0_8_ = local_15f0 + 0x10;
            sVar14 = strlen((char *)local_1038);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_15f0,local_1038,(long)&local_1038[0]._M_flags + sVar14);
            std::__cxx11::string::operator=((string *)local_1708._M_local_buf,(string *)local_15f0);
            if ((undefined1 *)local_15f0._0_8_ != local_15f0 + 0x10) {
              operator_delete((void *)local_15f0._0_8_,
                              (ulong)((long)(_Rb_tree_color *)local_15f0._16_8_ + 1));
            }
          }
          std::__cxx11::string::substr((ulong)local_15f0,(ulong)local_1728);
          std::__cxx11::string::operator=((string *)&local_16e8,(string *)local_15f0);
          if ((undefined1 *)local_15f0._0_8_ != local_15f0 + 0x10) {
            operator_delete((void *)local_15f0._0_8_,
                            (ulong)((long)(_Rb_tree_color *)local_15f0._16_8_ + 1));
          }
          std::__cxx11::string::find((char *)&local_16e8,0x1acb3a,0);
          std::__cxx11::string::substr((ulong)local_15f0,(ulong)&local_16e8);
          std::__cxx11::string::operator=((string *)&local_16e8,(string *)local_15f0);
          if ((undefined1 *)local_15f0._0_8_ != local_15f0 + 0x10) {
            operator_delete((void *)local_15f0._0_8_,
                            (ulong)((long)(_Rb_tree_color *)local_15f0._16_8_ + 1));
          }
          iVar11 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                   ::find(&local_1478,(key_type *)&local_1708);
          if ((_Rb_tree_header *)iVar11._M_node == &local_1478._M_impl.super__Rb_tree_header) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_15f0);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_15f0,"0x",2);
            *(uint *)(local_15f0 + *(long *)(local_15f0._0_8_ + -0x18) + 0x18) =
                 *(uint *)(local_15f0 + *(long *)(local_15f0._0_8_ + -0x18) + 0x18) & 0xffffffb5 | 8
            ;
            std::ostream::_M_insert<unsigned_long>((ulong)local_15f0);
            std::__cxx11::stringbuf::str();
          }
          else {
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                          *)&local_1478,(key_type *)&local_1708);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_15f0);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_15f0,"0x",2);
            *(uint *)(local_15f0 + *(long *)(local_15f0._0_8_ + -0x18) + 0x18) =
                 *(uint *)(local_15f0 + *(long *)(local_15f0._0_8_ + -0x18) + 0x18) & 0xffffffb5 | 8
            ;
            std::ostream::_M_insert<unsigned_long>((ulong)local_15f0);
            std::__cxx11::stringbuf::str();
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_15f0);
          std::ios_base::~ios_base((ios_base *)(local_15f0 + 0x70));
          std::__cxx11::string::operator=((string *)local_1688,(string *)local_16c8);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_16c8._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_16c8 + 0x10)) {
            operator_delete((void *)local_16c8._0_8_,(ulong)(local_16c8._16_8_ + 1));
          }
          if ((pointer)local_16e8._M_string_length != (pointer)0x0) {
            local_16c8._0_8_ = local_16c8._0_8_ & 0xffffffff00000000;
            pcVar13 = (char *)__cxa_demangle(local_16e8._M_dataplus._M_p,0,0,(string *)local_16c8);
            if (local_16c8._0_4_ == 0) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_15f0,pcVar13,(allocator<char> *)&local_1698);
              std::__cxx11::string::operator=((string *)&local_16e8,(string *)local_15f0);
              if ((undefined1 *)local_15f0._0_8_ != local_15f0 + 0x10) {
                operator_delete((void *)local_15f0._0_8_,
                                (ulong)((long)(_Rb_tree_color *)local_15f0._16_8_ + 1));
              }
            }
            if (pcVar13 != (char *)0x0) {
              free(pcVar13);
            }
          }
          local_16c8._0_8_ = local_16c8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_16c8,"");
          StackTraceEntry::StackTraceEntry
                    ((StackTraceEntry *)local_15f0,(int)local_16a8,(string *)local_1688,
                     (string *)&local_1708,&local_16e8,(string *)local_16c8,-1);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_16c8._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_16c8 + 0x10)) {
            operator_delete((void *)local_16c8._0_8_,(ulong)(local_16c8._16_8_ + 1));
          }
          std::vector<ust::StackTraceEntry,_std::allocator<ust::StackTraceEntry>_>::push_back
                    (&local_1658,(StackTraceEntry *)local_15f0);
          uVar24 = local_16a8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_15f0._104_8_ != local_1578) {
            operator_delete((void *)local_15f0._104_8_,local_1578[0]._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_15f0._72_8_ != local_15f0 + 0x58) {
            operator_delete((void *)local_15f0._72_8_,local_15f0._88_8_ + 1);
          }
          if ((undefined1 *)local_15f0._40_8_ != local_15f0 + 0x38) {
            operator_delete((void *)local_15f0._40_8_,local_15f0._56_8_ + 1);
          }
          if ((undefined1 *)local_15f0._8_8_ != local_15f0 + 0x18) {
            operator_delete((void *)local_15f0._8_8_,(ulong)(local_15f0._24_8_ + 1));
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1728._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_1728 + 0x10)) {
            operator_delete((void *)local_1728._0_8_,local_1728._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_16e8._M_dataplus._M_p != &local_16e8.field_2) {
            operator_delete(local_16e8._M_dataplus._M_p,local_16e8.field_2._M_allocated_capacity + 1
                           );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1708._M_allocated_capacity != &local_16f8) {
            operator_delete((void *)local_1708._M_allocated_capacity,
                            CONCAT71(local_16f8._M_allocated_capacity._1_7_,
                                     local_16f8._M_local_buf[0]) + 1);
          }
          if ((undefined1 *)local_1688._0_8_ != local_1688 + 0x10) {
            operator_delete((void *)local_1688._0_8_,local_1688._16_8_ + 1);
          }
          uVar24 = uVar24 + 1;
        } while (local_1690 != uVar24);
      }
      free(local_16a0);
    }
    pSVar6 = local_1658.
             super__Vector_base<ust::StackTraceEntry,_std::allocator<ust::StackTraceEntry>_>._M_impl
             .super__Vector_impl_data._M_finish;
    local_15f0._24_8_ = local_15f0 + 8;
    local_15f0._8_8_ = local_15f0._8_8_ & 0xffffffff00000000;
    local_15f0._16_8_ = (_Base_ptr)0x0;
    local_15f0._40_8_ = (pointer)0x0;
    local_1688._24_8_ = local_1688 + 8;
    local_1688._8_8_ = local_1688._8_8_ & 0xffffffff00000000;
    local_1688._16_8_ = 0;
    local_1660 = 0;
    local_1668 = (_Base_ptr)local_1688._24_8_;
    local_15f0._32_8_ = local_15f0._24_8_;
    if (local_1658.super__Vector_base<ust::StackTraceEntry,_std::allocator<ust::StackTraceEntry>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_1658.super__Vector_base<ust::StackTraceEntry,_std::allocator<ust::StackTraceEntry>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pkVar25 = &(local_1658.
                  super__Vector_base<ust::StackTraceEntry,_std::allocator<ust::StackTraceEntry>_>.
                  _M_impl.super__Vector_impl_data._M_start)->binaryFileName;
      do {
        if (pkVar25->_M_string_length != 0) {
          iVar15 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                           *)local_15f0,pkVar25);
          if (iVar15._M_node == (_Base_ptr)(local_15f0 + 8)) {
            plVar16 = (list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                      std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                    *)local_15f0,pkVar25);
            std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            _M_assign_dispatch<std::__cxx11::string_const*>(plVar16,0,0);
          }
          plVar16 = (list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                    std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                    ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                          *)local_15f0,pkVar25);
          p_Var17 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    _M_create_node<std::__cxx11::string_const&>(plVar16,pkVar25 + -1);
          std::__detail::_List_node_base::_M_hook(&p_Var17->super__List_node_base);
          *(long *)(plVar16 + 0x10) = *(long *)(plVar16 + 0x10) + 1;
        }
        pkVar5 = pkVar25 + 3;
        pkVar25 = (key_type *)&pkVar25[4].field_2;
      } while ((pointer)&pkVar5->_M_string_length != pSVar6);
    }
    if ((_Rb_tree_node_base *)local_15f0._24_8_ != (_Rb_tree_node_base *)(local_15f0 + 8)) {
      p_Var20 = (_Rb_tree_node_base *)local_15f0._24_8_;
      do {
        local_1708._M_allocated_capacity = (size_type)&local_16f8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1708,*(long *)(p_Var20 + 1),
                   (long)&(p_Var20[1]._M_parent)->_M_color + *(long *)(p_Var20 + 1));
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1038);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1038,"addr2line -C -f -p -e ",0x16);
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1038,(char *)local_1708._M_allocated_capacity,
                             local_1708._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18," ",1);
        p_Var27 = p_Var20 + 2;
        while (p_Var27 = *(_Rb_tree_node_base **)p_Var27, p_Var27 != p_Var20 + 2) {
          poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1038,(char *)p_Var27->_M_left,
                               (long)p_Var27->_M_right);
          std::__ostream_insert<char,std::char_traits<char>>(poVar18," ",1);
        }
        std::__cxx11::stringbuf::str();
        SystemToStr_abi_cxx11_(&local_16e8,(ust *)local_1728._0_8_,cmd);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1728._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1728 + 0x10)
           ) {
          operator_delete((void *)local_1728._0_8_,local_1728._16_8_ + 1);
        }
        if ((pointer)local_16e8._M_string_length != (pointer)0x0) {
          local_1728._0_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_1728._8_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_1728._16_8_ = 0;
          split<std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    (&local_16e8,'\n',
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_1728);
          std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          list<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                    ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_16c8,
                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )local_1728._0_8_,
                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )local_1728._8_8_,(allocator_type *)&local_1698);
          pmVar19 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                  *)local_1688,(key_type *)&local_1708);
          std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_move_assign(pmVar19,(_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_16c8);
          std::__cxx11::
          _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_16c8);
          Catch::clara::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1728);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_16e8._M_dataplus._M_p != &local_16e8.field_2) {
          operator_delete(local_16e8._M_dataplus._M_p,local_16e8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1038);
        std::ios_base::~ios_base(local_fc8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1708._M_allocated_capacity != &local_16f8) {
          operator_delete((void *)local_1708._M_allocated_capacity,
                          CONCAT71(local_16f8._M_allocated_capacity._1_7_,local_16f8._M_local_buf[0]
                                  ) + 1);
        }
        p_Var20 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var20);
      } while (p_Var20 != (_Rb_tree_node_base *)(local_15f0 + 8));
    }
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_1038,
               "^(.+?) at (.+):([0-9]+)",0x10);
    pSVar6 = local_1658.
             super__Vector_base<ust::StackTraceEntry,_std::allocator<ust::StackTraceEntry>_>._M_impl
             .super__Vector_impl_data._M_finish;
    if (local_1658.super__Vector_base<ust::StackTraceEntry,_std::allocator<ust::StackTraceEntry>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_1658.super__Vector_base<ust::StackTraceEntry,_std::allocator<ust::StackTraceEntry>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      this = (string *)
             &(local_1658.
               super__Vector_base<ust::StackTraceEntry,_std::allocator<ust::StackTraceEntry>_>.
               _M_impl.super__Vector_impl_data._M_start)->functionName;
      do {
        if (*(long *)(this + -0x18) != 0) {
          pkVar25 = (key_type *)(this + -0x20);
          iVar15 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                           *)local_1688,pkVar25);
          if (iVar15._M_node != (_Base_ptr)(local_1688 + 8)) {
            pmVar19 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                            *)local_1688,pkVar25);
            p_Var3 = (pmVar19->
                     super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl._M_node.super__List_node_base._M_next;
            local_1708._M_allocated_capacity = (size_type)&local_16f8;
            p_Var4 = p_Var3[1]._M_next;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1708,p_Var4,
                       (long)&(p_Var3[1]._M_prev)->_M_next + (long)p_Var4);
            pmVar19 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                            *)local_1688,pkVar25);
            std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_erase(pmVar19,(pmVar19->
                               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl._M_node.super__List_node_base._M_next);
            local_16e8._M_dataplus._M_p = (pointer)&local_16e8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_16e8,"?? ??:0","");
            if (local_1708._8_8_ == local_16e8._M_string_length) {
              if ((undefined1 *)local_1708._8_8_ == (undefined1 *)0x0) {
                bVar28 = true;
              }
              else {
                iVar8 = bcmp((void *)local_1708._M_allocated_capacity,local_16e8._M_dataplus._M_p,
                             local_1708._8_8_);
                bVar28 = iVar8 == 0;
              }
            }
            else {
              bVar28 = false;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_16e8._M_dataplus._M_p != &local_16e8.field_2) {
              operator_delete(local_16e8._M_dataplus._M_p,
                              local_16e8.field_2._M_allocated_capacity + 1);
            }
            if (!bVar28) {
              local_16e8.field_2._M_allocated_capacity = 0;
              local_16e8.field_2._8_8_ = 0;
              local_16e8._M_dataplus._M_p = (pointer)0x0;
              local_16e8._M_string_length = 0;
              bVar28 = std::__detail::
                       __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                                 ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   )local_1708._M_allocated_capacity,
                                  (char *)(local_1708._8_8_ + local_1708._M_allocated_capacity),
                                  (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   *)&local_16e8,
                                  (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_1038
                                  ,0);
              pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_1728 + 0x10);
              if (bVar28) {
                if (local_16e8._M_dataplus._M_p == (pointer)local_16e8._M_string_length) {
                  bVar28 = false;
                }
                else {
                  bVar28 = ((long)(local_16e8._M_string_length - (long)local_16e8._M_dataplus._M_p)
                           >> 3) * -0x5555555555555555 - 5U < 0xfffffffffffffffe;
                }
                pcVar13 = (char *)(local_16e8._M_string_length + -0x48);
                if (bVar28) {
                  pcVar13 = local_16e8._M_dataplus._M_p + 0x18;
                }
                local_1728._0_8_ = pbVar1;
                if (pcVar13[0x10] == '\x01') {
                  std::__cxx11::string::
                  _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                            ((string *)local_1728,*(undefined8 *)pcVar13,
                             *(undefined8 *)(pcVar13 + 8));
                }
                else {
                  local_1728._8_8_ =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                  local_1728._16_8_ = local_1728._16_8_ & 0xffffffffffffff00;
                }
                std::__cxx11::string::operator=(this,(string *)local_1728);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_1728._0_8_ != pbVar1) {
                  operator_delete((void *)local_1728._0_8_,local_1728._16_8_ + 1);
                }
                if (local_16e8._M_dataplus._M_p == (pointer)local_16e8._M_string_length) {
                  bVar28 = false;
                }
                else {
                  bVar28 = ((long)(local_16e8._M_string_length - (long)local_16e8._M_dataplus._M_p)
                           >> 3) * -0x5555555555555555 - 6U < 0xfffffffffffffffd;
                }
                pcVar13 = (char *)(local_16e8._M_string_length + -0x48);
                if (bVar28) {
                  pcVar13 = local_16e8._M_dataplus._M_p + 0x30;
                }
                if (pcVar13[0x10] == '\x01') {
                  local_1728._0_8_ = pbVar1;
                  std::__cxx11::string::
                  _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                            ((string *)local_1728,*(undefined8 *)pcVar13,
                             *(undefined8 *)(pcVar13 + 8));
                }
                else {
                  local_1728._8_8_ =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                  local_1728._16_8_ = local_1728._16_8_ & 0xffffffffffffff00;
                  local_1728._0_8_ = pbVar1;
                }
                std::__cxx11::string::operator=(this + 0x20,(string *)local_1728);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_1728._0_8_ != pbVar1) {
                  operator_delete((void *)local_1728._0_8_,local_1728._16_8_ + 1);
                }
                if (local_16e8._M_dataplus._M_p == (pointer)local_16e8._M_string_length) {
                  bVar28 = false;
                }
                else {
                  bVar28 = ((long)(local_16e8._M_string_length - (long)local_16e8._M_dataplus._M_p)
                           >> 3) * -0x5555555555555555 - 7U < 0xfffffffffffffffc;
                }
                pcVar13 = (char *)(local_16e8._M_string_length + -0x48);
                if (bVar28) {
                  pcVar13 = local_16e8._M_dataplus._M_p + 0x48;
                }
                if (pcVar13[0x10] == '\x01') {
                  local_1728._0_8_ = pbVar1;
                  std::__cxx11::string::
                  _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                            ((string *)local_1728,*(undefined8 *)pcVar13,
                             *(undefined8 *)(pcVar13 + 8));
                }
                else {
                  local_1728._8_8_ =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                  local_1728._16_8_ = local_1728._16_8_ & 0xffffffffffffff00;
                  local_1728._0_8_ = pbVar1;
                }
                uVar22 = local_1728._0_8_;
                piVar10 = __errno_location();
                iVar8 = *piVar10;
                *piVar10 = 0;
                lVar21 = strtol((char *)uVar22,(char **)local_16c8,10);
                if (local_16c8._0_8_ == uVar22) goto LAB_001a3573;
                if (((int)lVar21 != lVar21) || (*piVar10 == 0x22)) goto LAB_001a3567;
                if (*piVar10 == 0) {
                  *piVar10 = iVar8;
                }
                *(int *)(this + 0x40) = (int)lVar21;
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_1728._0_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_1728 + 0x10)) {
                  operator_delete((void *)local_1728._0_8_,local_1728._16_8_ + 1);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_16e8._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_16e8._M_dataplus._M_p,
                                local_16e8.field_2._M_allocated_capacity -
                                (long)local_16e8._M_dataplus._M_p);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1708._M_allocated_capacity != &local_16f8) {
              operator_delete((void *)local_1708._M_allocated_capacity,
                              CONCAT71(local_16f8._M_allocated_capacity._1_7_,
                                       local_16f8._M_local_buf[0]) + 1);
            }
          }
        }
        pSVar26 = (pointer)(this + 0x48);
        this = this + 0x90;
      } while (pSVar26 != pSVar6);
    }
    std::vector<ust::StackTraceEntry,_std::allocator<ust::StackTraceEntry>_>::vector
              (&local_1638->entries,&local_1658);
    Catch::clara::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              (local_1038);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 *)local_1688);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 *)local_15f0);
    std::ifstream::~ifstream(local_1240);
    if (local_1610[0] != local_1600) {
      operator_delete(local_1610[0],local_1600[0] + 1);
    }
    if (local_1630 != &local_1620) {
      operator_delete(local_1630,CONCAT71(uStack_161f,local_1620) + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
    ::~_Rb_tree(&local_1478);
    std::vector<ust::StackTraceEntry,_std::allocator<ust::StackTraceEntry>_>::~vector(&local_1658);
    pthread_mutex_unlock((pthread_mutex_t *)&generate::mtx);
    return local_1638;
  }
LAB_001a357f:
  uVar22 = std::__throw_system_error(iVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_16e8._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_16e8._M_dataplus._M_p,
                    local_16e8.field_2._M_allocated_capacity - (long)local_16e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1708._M_allocated_capacity != &local_16f8) {
    operator_delete((void *)local_1708._M_allocated_capacity,
                    CONCAT71(local_16f8._M_allocated_capacity._1_7_,local_16f8._M_local_buf[0]) + 1)
    ;
  }
  Catch::clara::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            (local_1038);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *)local_1688);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *)local_15f0);
  std::ifstream::~ifstream(local_1240);
  if (local_1610[0] != local_1600) {
    operator_delete(local_1610[0],local_1600[0] + 1);
  }
  if (local_1630 != &local_1620) {
    operator_delete(local_1630,CONCAT71(uStack_161f,local_1620) + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  ::~_Rb_tree(&local_1478);
  std::vector<ust::StackTraceEntry,_std::allocator<ust::StackTraceEntry>_>::~vector(&local_1658);
  pthread_mutex_unlock((pthread_mutex_t *)&generate::mtx);
  _Unwind_Resume(uVar22);
LAB_001a3567:
  std::__throw_out_of_range("stoi");
LAB_001a3573:
  iVar8 = std::__throw_invalid_argument("stoi");
  goto LAB_001a357f;
}

Assistant:

inline StackTrace generate() {
  // Libunwind and some other functions aren't thread safe.
  static std::mutex mtx;
  std::lock_guard<std::mutex> lock(mtx);

  std::vector<StackTraceEntry> stackTrace;
  std::map<std::string, std::pair<uint64_t, uint64_t> > addressMaps;
  std::string line;
  std::string procMapFileName = std::string("/proc/self/maps");
  std::ifstream infile(procMapFileName.c_str());
  // Some OSes don't have /proc/*/maps, so we won't have base addresses for them
  while (std::getline(infile, line)) {
    std::istringstream iss(line);
    std::string addressRange;
    std::string perms;
    std::string offset;
    std::string device;
    std::string inode;
    std::string path;

    if (!(iss >> addressRange >> perms >> offset >> device >> inode >> path)) {
      break;
    }  // error
    uint64_t startAddress = stoull(split(addressRange, '-')[0], NULL, 16);
    uint64_t endAddress = stoull(split(addressRange, '-')[1], NULL, 16);
    if (addressMaps.find(path) == addressMaps.end()) {
      addressMaps[path] = std::make_pair(startAddress, endAddress);
    } else {
      addressMaps[path].first = std::min(addressMaps[path].first, startAddress);
      addressMaps[path].second = std::max(addressMaps[path].second, endAddress);
    }
  }

#if !USE_UNWIND
  void *stack[MAX_STACK_FRAMES];
  int numFrames;
#endif
#if defined(__MINGW32__) || defined(__MINGW64__)
  numFrames = CaptureStackBackTrace(1, MAX_STACK_FRAMES, stack, NULL);

  for (unsigned short a = 0; a < numFrames; a++) {
    HMODULE moduleHandle;
    GetModuleHandleExA(GET_MODULE_HANDLE_EX_FLAG_FROM_ADDRESS,
                       (const char *)stack[a], &moduleHandle);
    std::string fileName(4096, '\0');
    auto fileNameSize =
        GetModuleFileNameA(moduleHandle, &fileName[0], fileName.size());
    if (fileNameSize == 0 || fileNameSize == (ssize_t)fileName.size()) {
      /* Error, possibly not enough space. */
      fileName = "";
    } else {
      fileName = fileName.substr(0, fileNameSize);
      std::replace(fileName.begin(), fileName.end(), '\\', '/');
    }
    std::string addr = addressToString(uint64_t(stack[a]));
    StackTraceEntry entry(a, addr, fileName, "", "", -1);
    stackTrace.push_back(entry);
  }
#elif USE_UNWIND
  unw_context_t context;
  unw_getcontext(&context);

  unw_cursor_t cursor;
  unw_init_local(&cursor, &context);

  unw_word_t ip;

  for (int a = 0; unw_step(&cursor) > 0; a++) {
    unw_get_reg(&cursor, UNW_REG_IP, &ip);
    static const size_t kMax = 16 * 1024;
    char mangled[kMax];
    unw_word_t offset;
    unw_get_proc_name(&cursor, mangled, kMax, &offset);

    int ok;
    char *demangled = abi::__cxa_demangle(mangled, 0, 0, &ok);

    std::string filename;
    uint64_t absoluteAddress = uint64_t(ip);
    uint64_t relativeAddress = 0;
    for (auto &it : addressMaps) {
      if (it.second.first <= absoluteAddress &&
          it.second.second > absoluteAddress) {
        filename = it.first;
        relativeAddress = absoluteAddress - it.second.first;
      }
    }

    StackTraceEntry entry(
        a,
        relativeAddress ? addressToString(relativeAddress)
                        : addressToString(absoluteAddress),
        filename, ok == 0 ? std::string(demangled) : std::string(mangled), "",
        -1);
    if (demangled) {
      free(demangled);
    }
    stackTrace.push_back(entry);
  }
#else
  numFrames = backtrace(stack, MAX_STACK_FRAMES);
  memmove(stack, stack + 1, sizeof(void *) * (numFrames - 1));
  numFrames--;

  char **strings = backtrace_symbols(stack, numFrames);
  if (strings) {
    for (int a = 0; a < numFrames; ++a) {
      std::string addr;
      std::string fileName;
      std::string functionName;

      const std::string line(strings[a]);
#ifdef __APPLE__
      // Example: ust-test                            0x000000010001e883
      // _ZNK5Catch21TestInvokerAsFunction6invokeEv + 19
      auto p = line.find("0x");
      if (p != std::string::npos) {
        addr = line.substr(p);
        auto spaceLoc = addr.find(" ");
        functionName = addr.substr(spaceLoc + 1);
        functionName = functionName.substr(0, functionName.find(" +"));
        addr = addr.substr(0, spaceLoc);
      }
#else
      // Example: ./ust-test(_ZNK5Catch21TestInvokerAsFunction6invokeEv+0x16)
      // [0x55f1278af96e]
      auto parenStart = line.find("(");
      auto parenEnd = line.find(")");
      fileName = line.substr(0, parenStart);
      // Convert filename to canonical path
      char buf[PATH_MAX];
      char *res = ::realpath(fileName.c_str(), buf);
      if (res)  // if realpath failed, use filename
        fileName = std::string(buf);
      functionName = line.substr(parenStart + 1, parenEnd - (parenStart + 1));
      // Strip off the offset from the name
      functionName = functionName.substr(0, functionName.find("+"));
      if (addressMaps.find(fileName) != addressMaps.end()) {
        // Make address relative to process start
        addr =
            addressToString(uint64_t(stack[a]) - addressMaps[fileName].first);
      } else {
        addr = addressToString(uint64_t(stack[a]));
      }
#endif
      // Perform demangling if parsed properly
      if (!functionName.empty()) {
        int status = 0;
        auto demangledFunctionName =
            abi::__cxa_demangle(functionName.data(), 0, 0, &status);
        // if demangling is successful, output the demangled function name
        if (status == 0) {
          // Success (see
          // http://gcc.gnu.org/onlinedocs/libstdc++/libstdc++-html-USERS-4.3/a01696.html)
          functionName = std::string(demangledFunctionName);
        }
        if (demangledFunctionName) {
          free(demangledFunctionName);
        }
      }
      StackTraceEntry entry(a, addr, fileName, functionName, "", -1);
      stackTrace.push_back(entry);
    }
    free(strings);
  }
#endif

// Fetch source file & line numbers
#ifdef __APPLE__
  std::ostringstream ss;
  ss << "atos -p " << std::to_string(getpid()) << " ";
  for (int a = 0; a < (int)stackTrace.size(); a++) {
    ss << stackTrace[a].address << " ";
  }
  auto atosOutput = SystemToStr(ss.str().c_str());
  if (atosOutput.length()) {
    auto atosLines = split(atosOutput, '\n');
    std::regex fileLineRegex("\\(([^\\(]+):([0-9]+)\\)");
    for (int a = 0; a < (int)stackTrace.size(); a++) {
      // Find the filename and line number
      std::smatch matches;
      if (regex_search(atosLines[a], matches, fileLineRegex)) {
        stackTrace[a].sourceFileName = matches[1];
        stackTrace[a].lineNumber = std::stoi(matches[2]);
      }
    }
  }
#else
  // Unix & MinGW
  std::map<std::string, std::list<std::string> > fileAddresses;
  std::map<std::string, std::list<std::string> > fileData;
  for (const auto &it : stackTrace) {
    if (it.binaryFileName.length()) {
      if (fileAddresses.find(it.binaryFileName) == fileAddresses.end()) {
        fileAddresses[it.binaryFileName] = {};
      }
      fileAddresses.at(it.binaryFileName).push_back(it.address);
    }
  }
  for (const auto &it : fileAddresses) {
    std::string fileName = it.first;
    std::ostringstream ss;
    ss << "addr2line -C -f -p -e " << fileName << " ";
    for (const auto &it2 : it.second) {
      ss << it2 << " ";
    }
    auto addrLineOutput = SystemToStr(ss.str().c_str());
    if (addrLineOutput.length()) {
      auto outputLines = split(addrLineOutput, '\n');
      fileData[fileName] =
          std::list<std::string>(outputLines.begin(), outputLines.end());
    }
  }
  std::regex addrToLineRegex("^(.+?) at (.+):([0-9]+)");
  for (auto &it : stackTrace) {
    if (it.binaryFileName.length() &&
        fileData.find(it.binaryFileName) != fileData.end()) {
      std::string outputLine = fileData.at(it.binaryFileName).front();
      fileData.at(it.binaryFileName).pop_front();
      if (outputLine == std::string("?? ??:0")) {
        continue;
      }
      std::smatch matches;
      if (regex_search(outputLine, matches, addrToLineRegex)) {
        it.functionName = matches[1];
        it.sourceFileName = matches[2];
        it.lineNumber = std::stoi(matches[3]);
      }
    }
  }
#endif

  return StackTrace(stackTrace);
#endif
}